

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_after.c
# Opt level: O1

mpt_node * mpt_gnode_after(mpt_node *position,mpt_node *insert)

{
  int *piVar1;
  
  if (insert != (mpt_node *)0x0) {
    if (insert != position && position != (mpt_node *)0x0) {
      insert->prev = position;
      insert->next = position->next;
      position->next = insert;
      insert->parent = position->parent;
      if (insert->next != (mpt_node *)0x0) {
        insert->next->prev = insert;
      }
    }
    return insert;
  }
  piVar1 = __errno_location();
  *piVar1 = 0xe;
  return (mpt_node *)0x0;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_after(MPT_STRUCT(node) *position, MPT_STRUCT(node) *insert)
{
	if (!insert) {
		errno = EFAULT;
		return 0;
	}
	
	/* no previous node, avoid self-reference */
	if (!position || insert == position) {
		return insert;
	}
	/* avoid self-reference */
	insert->prev = position;
	insert->next = position->next;
	position->next = insert;
	
	insert->parent = position->parent;
	
	if ((position = insert->next)) {
		position->prev = insert;
	}
	return insert;
}